

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O1

void anon_unknown.dwarf_e46b9e::ResolveObjectPlacement
               (aiMatrix4x4 *m,IfcObjectPlacement *place,ConversionData *conv)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  _func_int **pp_Var17;
  long lVar18;
  IfcObjectPlacement *place_00;
  long *plVar19;
  long *plVar20;
  aiMatrix4x4 tmp_1;
  IfcMatrix4 tmp;
  allocator<char> local_259 [89];
  long *local_200 [2];
  long local_1f0 [2];
  undefined1 local_1e0 [32];
  undefined8 uStack_1c0;
  float local_1b8;
  undefined8 local_1b4;
  undefined8 uStack_1ac;
  float local_1a4;
  undefined1 local_1a0 [8];
  double local_198;
  double dStack_190;
  double local_188;
  double dStack_180;
  double local_178;
  double local_170;
  double dStack_168;
  double local_160;
  double dStack_158;
  double local_150;
  double local_148;
  double dStack_140;
  double local_138;
  double dStack_130;
  double local_128;
  
  pp_Var17 = (place->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObjectPlacement,_0UL>).
             _vptr_ObjectHelper;
  lVar18 = __dynamic_cast((_func_int *)
                          ((long)&(place->
                                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObjectPlacement,_0UL>
                                  )._vptr_ObjectHelper + (long)pp_Var17[-3]),
                          &Assimp::STEP::Object::typeinfo,
                          &Assimp::IFC::Schema_2x3::IfcLocalPlacement::typeinfo,0xffffffffffffffff);
  if (lVar18 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_200,
               *(char **)(&(place->
                           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObjectPlacement,_0UL>).
                           field_0x10 + (long)pp_Var17[-3]),local_259);
    plVar19 = (long *)std::__cxx11::string::replace((ulong)local_200,0,(char *)0x0,0x6f0c82);
    plVar20 = plVar19 + 2;
    if ((long *)*plVar19 == plVar20) {
      local_1e0._24_8_ = plVar19[3];
      local_1e0._16_4_ = (undefined4)*plVar20;
      local_1e0._20_4_ = (undefined4)((ulong)*plVar20 >> 0x20);
      local_1e0._0_8_ = local_1e0 + 0x10;
    }
    else {
      local_1e0._16_4_ = (undefined4)*plVar20;
      local_1e0._20_4_ = (undefined4)((ulong)*plVar20 >> 0x20);
      local_1e0._0_8_ = (long *)*plVar19;
    }
    local_1e0._8_4_ = (undefined4)plVar19[1];
    local_1e0._12_4_ = (undefined4)((ulong)plVar19[1] >> 0x20);
    *plVar19 = (long)plVar20;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    Assimp::Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
    basic_formatter<std::__cxx11::string>
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0);
    Assimp::LogFunctions<Assimp::IFCImporter>::LogWarn((format *)local_1a0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base((ios_base *)&dStack_130);
    if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
      operator_delete((void *)local_1e0._0_8_,CONCAT44(local_1e0._20_4_,local_1e0._16_4_) + 1);
    }
    if (local_200[0] != local_1f0) {
      operator_delete(local_200[0],local_1f0[0] + 1);
    }
  }
  else {
    local_1a0 = (undefined1  [8])0x3ff0000000000000;
    local_198 = 0.0;
    dStack_190 = 0.0;
    local_188 = 0.0;
    dStack_180 = 0.0;
    local_178 = 1.0;
    local_170 = 0.0;
    dStack_168 = 0.0;
    local_160 = 0.0;
    dStack_158 = 0.0;
    local_150 = 1.0;
    local_148 = 0.0;
    dStack_140 = 0.0;
    local_138 = 0.0;
    dStack_130 = 0.0;
    local_128 = 1.0;
    Assimp::IFC::ConvertAxisPlacement
              ((IfcMatrix4 *)local_1a0,*(IfcAxis2Placement **)(lVar18 + 0x30),conv);
    m->a1 = (float)(double)local_1a0;
    m->a2 = (float)local_198;
    m->a3 = (float)dStack_190;
    m->a4 = (float)local_188;
    m->b1 = (float)dStack_180;
    m->b2 = (float)local_178;
    m->b3 = (float)local_170;
    m->b4 = (float)dStack_168;
    m->c1 = (float)local_160;
    m->c2 = (float)dStack_158;
    m->c3 = (float)local_150;
    m->c4 = (float)local_148;
    m->d1 = (float)dStack_140;
    m->d2 = (float)local_138;
    m->d3 = (float)dStack_130;
    m->d4 = (float)local_128;
    if (*(char *)(lVar18 + 0x28) == '\x01') {
      local_1e0._0_4_ = 1.0;
      local_1e0._4_4_ = 0.0;
      local_1e0._8_4_ = 0.0;
      local_1e0._12_4_ = 0.0;
      local_1e0._16_4_ = 0.0;
      local_1e0._20_4_ = 1.0;
      local_1e0._24_4_ = 0.0;
      local_1e0._28_4_ = 0.0;
      uStack_1c0._0_4_ = 0.0;
      uStack_1c0._4_4_ = 0.0;
      local_1b8 = 1.0;
      local_1b4._0_4_ = 0.0;
      local_1b4._4_4_ = 0.0;
      uStack_1ac._0_4_ = 0.0;
      uStack_1ac._4_4_ = 0.0;
      local_1a4 = 1.0;
      place_00 = Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcObjectPlacement>
                           (*(LazyObject **)(lVar18 + 0x20));
      ResolveObjectPlacement((aiMatrix4x4 *)local_1e0,place_00,conv);
      fVar1 = m->b1;
      fVar2 = m->a1;
      fVar3 = m->a2;
      fVar4 = m->c1;
      fVar5 = m->d1;
      fVar6 = m->b2;
      fVar7 = m->c2;
      fVar8 = m->d2;
      fVar9 = m->b3;
      fVar10 = m->a3;
      fVar11 = m->c3;
      fVar12 = m->d3;
      fVar13 = m->b4;
      fVar14 = m->a4;
      fVar15 = m->c4;
      fVar16 = m->d4;
      m->a1 = fVar5 * (float)local_1e0._12_4_ +
              fVar4 * (float)local_1e0._8_4_ +
              fVar2 * (float)local_1e0._0_4_ + (float)local_1e0._4_4_ * fVar1;
      m->a2 = fVar8 * (float)local_1e0._12_4_ +
              fVar7 * (float)local_1e0._8_4_ +
              fVar3 * (float)local_1e0._0_4_ + (float)local_1e0._4_4_ * fVar6;
      m->a3 = fVar12 * (float)local_1e0._12_4_ +
              fVar11 * (float)local_1e0._8_4_ +
              fVar10 * (float)local_1e0._0_4_ + (float)local_1e0._4_4_ * fVar9;
      m->a4 = (float)local_1e0._12_4_ * fVar16 +
              (float)local_1e0._8_4_ * fVar15 +
              (float)local_1e0._0_4_ * fVar14 + (float)local_1e0._4_4_ * fVar13;
      m->b1 = fVar5 * (float)local_1e0._28_4_ +
              fVar4 * (float)local_1e0._24_4_ +
              fVar2 * (float)local_1e0._16_4_ + (float)local_1e0._20_4_ * fVar1;
      m->b2 = fVar8 * (float)local_1e0._28_4_ +
              fVar7 * (float)local_1e0._24_4_ +
              fVar3 * (float)local_1e0._16_4_ + (float)local_1e0._20_4_ * fVar6;
      m->b3 = fVar12 * (float)local_1e0._28_4_ +
              fVar11 * (float)local_1e0._24_4_ +
              fVar10 * (float)local_1e0._16_4_ + (float)local_1e0._20_4_ * fVar9;
      m->b4 = (float)local_1e0._28_4_ * fVar16 +
              (float)local_1e0._24_4_ * fVar15 +
              (float)local_1e0._16_4_ * fVar14 + (float)local_1e0._20_4_ * fVar13;
      m->c1 = fVar5 * (float)local_1b4 +
              fVar4 * local_1b8 + fVar2 * (float)uStack_1c0 + uStack_1c0._4_4_ * fVar1;
      m->c2 = fVar8 * (float)local_1b4 +
              fVar7 * local_1b8 + fVar3 * (float)uStack_1c0 + uStack_1c0._4_4_ * fVar6;
      m->c3 = fVar12 * (float)local_1b4 +
              fVar11 * local_1b8 + fVar10 * (float)uStack_1c0 + uStack_1c0._4_4_ * fVar9;
      m->c4 = (float)local_1b4 * fVar16 +
              local_1b8 * fVar15 + (float)uStack_1c0 * fVar14 + uStack_1c0._4_4_ * fVar13;
      m->d1 = fVar5 * local_1a4 +
              fVar4 * uStack_1ac._4_4_ + fVar2 * local_1b4._4_4_ + fVar1 * (float)uStack_1ac;
      m->d2 = fVar8 * local_1a4 +
              fVar7 * uStack_1ac._4_4_ + fVar3 * local_1b4._4_4_ + fVar6 * (float)uStack_1ac;
      m->d3 = fVar12 * local_1a4 +
              fVar11 * uStack_1ac._4_4_ + fVar10 * local_1b4._4_4_ + fVar9 * (float)uStack_1ac;
      m->d4 = fVar16 * local_1a4 +
              fVar15 * uStack_1ac._4_4_ + fVar14 * local_1b4._4_4_ + (float)uStack_1ac * fVar13;
    }
  }
  return;
}

Assistant:

void ResolveObjectPlacement(aiMatrix4x4& m, const Schema_2x3::IfcObjectPlacement& place, ConversionData& conv)
{
    if (const Schema_2x3::IfcLocalPlacement* const local = place.ToPtr<Schema_2x3::IfcLocalPlacement>()){
        IfcMatrix4 tmp;
        ConvertAxisPlacement(tmp, *local->RelativePlacement, conv);

        m = static_cast<aiMatrix4x4>(tmp);

        if (local->PlacementRelTo) {
            aiMatrix4x4 tmp;
            ResolveObjectPlacement(tmp,local->PlacementRelTo.Get(),conv);
            m = tmp * m;
        }
    }
    else {
        IFCImporter::LogWarn("skipping unknown IfcObjectPlacement entity, type is " + place.GetClassName());
    }
}